

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_avx2.c
# Opt level: O2

void highbd_update_mask0_avx2
               (__m256i *qcoeff0,__m256i *qcoeff1,__m256i *threshold,int16_t *iscan_ptr,
               int *is_found,__m256i *mask)

{
  __m256i alVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  
  auVar2 = vpslld_avx2((undefined1  [32])*qcoeff0,5);
  auVar2 = vpcmpgtd_avx2(auVar2,(undefined1  [32])*threshold);
  auVar3 = vpslld_avx2((undefined1  [32])*qcoeff1,5);
  auVar3 = vpcmpgtd_avx2(auVar3,(undefined1  [32])threshold[1]);
  auVar2 = vpackssdw_avx2(auVar2,auVar3);
  if ((((((((((((((((((((((((((((((((auVar2 >> 7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                   && (auVar2 >> 0xf & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                  (auVar2 >> 0x17 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                                 && (auVar2 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar2 >> 0x27 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar2 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                              && (auVar2 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (auVar2 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                            && (auVar2 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar2 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar2 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar2 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar2 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar2 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar2 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar2 >> 0x7f,0) == '\0') &&
                    (auVar2 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar2 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar2 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar2 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar2 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar2 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar2 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar2 >> 0xbf,0) == '\0') &&
            (auVar2 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar2 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar2 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         (auVar2 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        (auVar2 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
       (auVar2 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
      (auVar2 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < auVar2[0x1f]) {
    auVar2 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  }
  else {
    auVar2 = vpermq_avx2(auVar2,0xd8);
    auVar2 = vpand_avx2(auVar2,*(undefined1 (*) [32])iscan_ptr);
    *is_found = 1;
  }
  alVar1 = (__m256i)vpmaxsw_avx2(auVar2,(undefined1  [32])*mask);
  *mask = alVar1;
  return;
}

Assistant:

static inline void highbd_update_mask0_avx2(__m256i *qcoeff0, __m256i *qcoeff1,
                                            __m256i *threshold,
                                            const int16_t *iscan_ptr,
                                            int *is_found, __m256i *mask) {
  __m256i coeff[2], cmp_mask0, cmp_mask1;
  coeff[0] = _mm256_slli_epi32(*qcoeff0, AOM_QM_BITS);
  cmp_mask0 = _mm256_cmpgt_epi32(coeff[0], threshold[0]);
  coeff[1] = _mm256_slli_epi32(*qcoeff1, AOM_QM_BITS);
  cmp_mask1 = _mm256_cmpgt_epi32(coeff[1], threshold[1]);
  cmp_mask0 =
      _mm256_permute4x64_epi64(_mm256_packs_epi32(cmp_mask0, cmp_mask1), 0xd8);
  highbd_update_mask1_avx2(&cmp_mask0, iscan_ptr, is_found, mask);
}